

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O2

bool __thiscall
BuildLog::Restat(BuildLog *this,StringPiece path,DiskInterface *disk_interface,int output_count,
                char **outputs,string *err)

{
  Metrics *this_00;
  bool bVar1;
  int iVar2;
  FILE *__stream;
  undefined4 extraout_var;
  int *piVar3;
  Metric *pMVar4;
  _Hash_node_base entry;
  int j;
  ulong uVar5;
  _Hash_node_base this_01;
  ulong uVar6;
  __node_base *p_Var7;
  StringPiece path_local;
  string temp_path;
  ScopedMetric metrics_h_scoped;
  string local_50;
  
  path_local.len_ = path.len_;
  path_local.str_ = path.str_;
  if ((Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)::metrics_h_metric
       == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar2 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar4 = (Metric *)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&temp_path,".ninja_log restat",(allocator<char> *)&local_50);
      pMVar4 = Metrics::NewMetric(this_00,&temp_path);
      std::__cxx11::string::~string((string *)&temp_path);
    }
    Restat::metrics_h_metric = pMVar4;
    __cxa_guard_release(&Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,Restat::metrics_h_metric);
  Close(this);
  StringPiece::AsString_abi_cxx11_(&local_50,&path_local);
  std::operator+(&temp_path,&local_50,".restat");
  std::__cxx11::string::~string((string *)&local_50);
  __stream = fopen(temp_path._M_dataplus._M_p,"wb");
  if (__stream == (FILE *)0x0) {
LAB_001764f4:
    piVar3 = __errno_location();
    strerror(*piVar3);
    std::__cxx11::string::assign((char *)err);
  }
  else {
    uVar6 = 0;
    this_01._M_nxt = (_Hash_node_base *)__stream;
    iVar2 = fprintf(__stream,"# ninja log v%d\n",5);
    if (iVar2 < 0) {
      piVar3 = __errno_location();
      strerror(*piVar3);
      std::__cxx11::string::assign((char *)err);
    }
    else {
      p_Var7 = &(this->entries_)._M_h._M_before_begin;
      if (0 < output_count) {
        uVar6 = (ulong)(uint)output_count;
      }
      do {
        p_Var7 = p_Var7->_M_nxt;
        if (p_Var7 == (__node_base *)0x0) {
          fclose(__stream);
          iVar2 = unlink(path_local.str_);
          if (iVar2 < 0) goto LAB_001764f4;
          iVar2 = rename(temp_path._M_dataplus._M_p,path_local.str_);
          bVar1 = true;
          if (-1 < iVar2) goto LAB_00176512;
          goto LAB_001764f4;
        }
        uVar5 = 0;
        do {
          if (uVar6 == uVar5) {
            if (0 < output_count) {
              entry._M_nxt = p_Var7[3]._M_nxt;
              goto LAB_00176479;
            }
            break;
          }
          this_01._M_nxt = p_Var7[3]._M_nxt;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)this_01._M_nxt,outputs[uVar5]);
          uVar5 = uVar5 + 1;
        } while (!bVar1);
        this_01._M_nxt = (_Hash_node_base *)disk_interface;
        iVar2 = (*(disk_interface->super_FileReader)._vptr_FileReader[3])
                          (disk_interface,p_Var7[3]._M_nxt,err);
        if (CONCAT44(extraout_var,iVar2) == -1) goto LAB_001764bf;
        entry._M_nxt = p_Var7[3]._M_nxt;
        entry._M_nxt[6] = (_Hash_node_base)CONCAT44(extraout_var,iVar2);
LAB_00176479:
        bVar1 = WriteEntry((BuildLog *)this_01._M_nxt,(FILE *)__stream,(LogEntry *)entry._M_nxt);
      } while (bVar1);
      piVar3 = __errno_location();
      strerror(*piVar3);
      std::__cxx11::string::assign((char *)err);
    }
LAB_001764bf:
    fclose(__stream);
  }
  bVar1 = false;
LAB_00176512:
  std::__cxx11::string::~string((string *)&temp_path);
  ScopedMetric::~ScopedMetric(&metrics_h_scoped);
  return bVar1;
}

Assistant:

bool BuildLog::Restat(const StringPiece path,
                      const DiskInterface& disk_interface,
                      const int output_count, char** outputs,
                      std::string* const err) {
  METRIC_RECORD(".ninja_log restat");

  Close();
  std::string temp_path = path.AsString() + ".restat";
  FILE* f = fopen(temp_path.c_str(), "wb");
  if (!f) {
    *err = strerror(errno);
    return false;
  }

  if (fprintf(f, kFileSignature, kCurrentVersion) < 0) {
    *err = strerror(errno);
    fclose(f);
    return false;
  }
  for (Entries::iterator i = entries_.begin(); i != entries_.end(); ++i) {
    bool skip = output_count > 0;
    for (int j = 0; j < output_count; ++j) {
      if (i->second->output == outputs[j]) {
        skip = false;
        break;
      }
    }
    if (!skip) {
      const TimeStamp mtime = disk_interface.Stat(i->second->output, err);
      if (mtime == -1) {
        fclose(f);
        return false;
      }
      i->second->mtime = mtime;
    }

    if (!WriteEntry(f, *i->second)) {
      *err = strerror(errno);
      fclose(f);
      return false;
    }
  }

  fclose(f);
  if (unlink(path.str_) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.str_) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}